

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Disassembler.c
# Opt level: O0

_Bool translateRMRegister(MCInst *mcInst,InternalInstruction *insn)

{
  long in_RSI;
  MCInst *in_RDI;
  
  if ((*(int *)(in_RSI + 0x138) != 0x15) && (*(int *)(in_RSI + 0x138) != 0x25)) {
    switch(*(undefined4 *)(in_RSI + 0x138)) {
    case 0:
      return true;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x20:
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
      return true;
    case 0x31:
      MCOperand_CreateReg0(in_RDI,2);
      break;
    case 0x32:
      MCOperand_CreateReg0(in_RDI,10);
      break;
    case 0x33:
      MCOperand_CreateReg0(in_RDI,0x10);
      break;
    case 0x34:
      MCOperand_CreateReg0(in_RDI,5);
      break;
    case 0x35:
      MCOperand_CreateReg0(in_RDI,1);
      break;
    case 0x36:
      MCOperand_CreateReg0(in_RDI,9);
      break;
    case 0x37:
      MCOperand_CreateReg0(in_RDI,0xd);
      break;
    case 0x38:
      MCOperand_CreateReg0(in_RDI,4);
      break;
    case 0x39:
      MCOperand_CreateReg0(in_RDI,0xda);
      break;
    case 0x3a:
      MCOperand_CreateReg0(in_RDI,0xdb);
      break;
    case 0x3b:
      MCOperand_CreateReg0(in_RDI,0xdc);
      break;
    case 0x3c:
      MCOperand_CreateReg0(in_RDI,0xdd);
      break;
    case 0x3d:
      MCOperand_CreateReg0(in_RDI,0xde);
      break;
    case 0x3e:
      MCOperand_CreateReg0(in_RDI,0xdf);
      break;
    case 0x3f:
      MCOperand_CreateReg0(in_RDI,0xe0);
      break;
    case 0x40:
      MCOperand_CreateReg0(in_RDI,0xe1);
      break;
    case 0x41:
      MCOperand_CreateReg0(in_RDI,0x30);
      break;
    case 0x42:
      MCOperand_CreateReg0(in_RDI,7);
      break;
    case 0x43:
      MCOperand_CreateReg0(in_RDI,0x2e);
      break;
    case 0x44:
      MCOperand_CreateReg0(in_RDI,0xf);
      break;
    case 0x45:
      MCOperand_CreateReg0(in_RDI,3);
      break;
    case 0x46:
      MCOperand_CreateReg0(in_RDI,0xc);
      break;
    case 0x47:
      MCOperand_CreateReg0(in_RDI,0x12);
      break;
    case 0x48:
      MCOperand_CreateReg0(in_RDI,8);
      break;
    case 0x49:
      MCOperand_CreateReg0(in_RDI,0x2f);
      break;
    case 0x4a:
      MCOperand_CreateReg0(in_RDI,6);
      break;
    case 0x4b:
      MCOperand_CreateReg0(in_RDI,0x2d);
      break;
    case 0x4c:
      MCOperand_CreateReg0(in_RDI,0xe);
      break;
    case 0x4d:
      MCOperand_CreateReg0(in_RDI,0xea);
      break;
    case 0x4e:
      MCOperand_CreateReg0(in_RDI,0xeb);
      break;
    case 0x4f:
      MCOperand_CreateReg0(in_RDI,0xec);
      break;
    case 0x50:
      MCOperand_CreateReg0(in_RDI,0xed);
      break;
    case 0x51:
      MCOperand_CreateReg0(in_RDI,0xee);
      break;
    case 0x52:
      MCOperand_CreateReg0(in_RDI,0xef);
      break;
    case 0x53:
      MCOperand_CreateReg0(in_RDI,0xf0);
      break;
    case 0x54:
      MCOperand_CreateReg0(in_RDI,0xf1);
      break;
    case 0x55:
      MCOperand_CreateReg0(in_RDI,0x13);
      break;
    case 0x56:
      MCOperand_CreateReg0(in_RDI,0x16);
      break;
    case 0x57:
      MCOperand_CreateReg0(in_RDI,0x18);
      break;
    case 0x58:
      MCOperand_CreateReg0(in_RDI,0x15);
      break;
    case 0x59:
      MCOperand_CreateReg0(in_RDI,0x1e);
      break;
    case 0x5a:
      MCOperand_CreateReg0(in_RDI,0x14);
      break;
    case 0x5b:
      MCOperand_CreateReg0(in_RDI,0x1d);
      break;
    case 0x5c:
      MCOperand_CreateReg0(in_RDI,0x17);
      break;
    case 0x5d:
      MCOperand_CreateReg0(in_RDI,0xe2);
      break;
    case 0x5e:
      MCOperand_CreateReg0(in_RDI,0xe3);
      break;
    case 0x5f:
      MCOperand_CreateReg0(in_RDI,0xe4);
      break;
    case 0x60:
      MCOperand_CreateReg0(in_RDI,0xe5);
      break;
    case 0x61:
      MCOperand_CreateReg0(in_RDI,0xe6);
      break;
    case 0x62:
      MCOperand_CreateReg0(in_RDI,0xe7);
      break;
    case 99:
      MCOperand_CreateReg0(in_RDI,0xe8);
      break;
    case 100:
      MCOperand_CreateReg0(in_RDI,0xe9);
      break;
    case 0x65:
      MCOperand_CreateReg0(in_RDI,0x23);
      break;
    case 0x66:
      MCOperand_CreateReg0(in_RDI,0x26);
      break;
    case 0x67:
      MCOperand_CreateReg0(in_RDI,0x28);
      break;
    case 0x68:
      MCOperand_CreateReg0(in_RDI,0x25);
      break;
    case 0x69:
      MCOperand_CreateReg0(in_RDI,0x2c);
      break;
    case 0x6a:
      MCOperand_CreateReg0(in_RDI,0x24);
      break;
    case 0x6b:
      MCOperand_CreateReg0(in_RDI,0x2b);
      break;
    case 0x6c:
      MCOperand_CreateReg0(in_RDI,0x27);
      break;
    case 0x6d:
      MCOperand_CreateReg0(in_RDI,0x6a);
      break;
    case 0x6e:
      MCOperand_CreateReg0(in_RDI,0x6b);
      break;
    case 0x6f:
      MCOperand_CreateReg0(in_RDI,0x6c);
      break;
    case 0x70:
      MCOperand_CreateReg0(in_RDI,0x6d);
      break;
    case 0x71:
      MCOperand_CreateReg0(in_RDI,0x6e);
      break;
    case 0x72:
      MCOperand_CreateReg0(in_RDI,0x6f);
      break;
    case 0x73:
      MCOperand_CreateReg0(in_RDI,0x70);
      break;
    case 0x74:
      MCOperand_CreateReg0(in_RDI,0x71);
      break;
    case 0x75:
      MCOperand_CreateReg0(in_RDI,0x62);
      break;
    case 0x76:
      MCOperand_CreateReg0(in_RDI,99);
      break;
    case 0x77:
      MCOperand_CreateReg0(in_RDI,100);
      break;
    case 0x78:
      MCOperand_CreateReg0(in_RDI,0x65);
      break;
    case 0x79:
      MCOperand_CreateReg0(in_RDI,0x66);
      break;
    case 0x7a:
      MCOperand_CreateReg0(in_RDI,0x67);
      break;
    case 0x7b:
      MCOperand_CreateReg0(in_RDI,0x68);
      break;
    case 0x7c:
      MCOperand_CreateReg0(in_RDI,0x69);
      break;
    case 0x7d:
      MCOperand_CreateReg0(in_RDI,0x7a);
      break;
    case 0x7e:
      MCOperand_CreateReg0(in_RDI,0x7b);
      break;
    case 0x7f:
      MCOperand_CreateReg0(in_RDI,0x7c);
      break;
    case 0x80:
      MCOperand_CreateReg0(in_RDI,0x7d);
      break;
    case 0x81:
      MCOperand_CreateReg0(in_RDI,0x7e);
      break;
    case 0x82:
      MCOperand_CreateReg0(in_RDI,0x7f);
      break;
    case 0x83:
      MCOperand_CreateReg0(in_RDI,0x80);
      break;
    case 0x84:
      MCOperand_CreateReg0(in_RDI,0x81);
      break;
    case 0x85:
      MCOperand_CreateReg0(in_RDI,0x82);
      break;
    case 0x86:
      MCOperand_CreateReg0(in_RDI,0x83);
      break;
    case 0x87:
      MCOperand_CreateReg0(in_RDI,0x84);
      break;
    case 0x88:
      MCOperand_CreateReg0(in_RDI,0x85);
      break;
    case 0x89:
      MCOperand_CreateReg0(in_RDI,0x86);
      break;
    case 0x8a:
      MCOperand_CreateReg0(in_RDI,0x87);
      break;
    case 0x8b:
      MCOperand_CreateReg0(in_RDI,0x88);
      break;
    case 0x8c:
      MCOperand_CreateReg0(in_RDI,0x89);
      break;
    case 0x8d:
      MCOperand_CreateReg0(in_RDI,0x8a);
      break;
    case 0x8e:
      MCOperand_CreateReg0(in_RDI,0x8b);
      break;
    case 0x8f:
      MCOperand_CreateReg0(in_RDI,0x8c);
      break;
    case 0x90:
      MCOperand_CreateReg0(in_RDI,0x8d);
      break;
    case 0x91:
      MCOperand_CreateReg0(in_RDI,0x8e);
      break;
    case 0x92:
      MCOperand_CreateReg0(in_RDI,0x8f);
      break;
    case 0x93:
      MCOperand_CreateReg0(in_RDI,0x90);
      break;
    case 0x94:
      MCOperand_CreateReg0(in_RDI,0x91);
      break;
    case 0x95:
      MCOperand_CreateReg0(in_RDI,0x92);
      break;
    case 0x96:
      MCOperand_CreateReg0(in_RDI,0x93);
      break;
    case 0x97:
      MCOperand_CreateReg0(in_RDI,0x94);
      break;
    case 0x98:
      MCOperand_CreateReg0(in_RDI,0x95);
      break;
    case 0x99:
      MCOperand_CreateReg0(in_RDI,0x96);
      break;
    case 0x9a:
      MCOperand_CreateReg0(in_RDI,0x97);
      break;
    case 0x9b:
      MCOperand_CreateReg0(in_RDI,0x98);
      break;
    case 0x9c:
      MCOperand_CreateReg0(in_RDI,0x99);
      break;
    case 0x9d:
      MCOperand_CreateReg0(in_RDI,0x9a);
      break;
    case 0x9e:
      MCOperand_CreateReg0(in_RDI,0x9b);
      break;
    case 0x9f:
      MCOperand_CreateReg0(in_RDI,0x9c);
      break;
    case 0xa0:
      MCOperand_CreateReg0(in_RDI,0x9d);
      break;
    case 0xa1:
      MCOperand_CreateReg0(in_RDI,0x9e);
      break;
    case 0xa2:
      MCOperand_CreateReg0(in_RDI,0x9f);
      break;
    case 0xa3:
      MCOperand_CreateReg0(in_RDI,0xa0);
      break;
    case 0xa4:
      MCOperand_CreateReg0(in_RDI,0xa1);
      break;
    case 0xa5:
      MCOperand_CreateReg0(in_RDI,0xa2);
      break;
    case 0xa6:
      MCOperand_CreateReg0(in_RDI,0xa3);
      break;
    case 0xa7:
      MCOperand_CreateReg0(in_RDI,0xa4);
      break;
    case 0xa8:
      MCOperand_CreateReg0(in_RDI,0xa5);
      break;
    case 0xa9:
      MCOperand_CreateReg0(in_RDI,0xa6);
      break;
    case 0xaa:
      MCOperand_CreateReg0(in_RDI,0xa7);
      break;
    case 0xab:
      MCOperand_CreateReg0(in_RDI,0xa8);
      break;
    case 0xac:
      MCOperand_CreateReg0(in_RDI,0xa9);
      break;
    case 0xad:
      MCOperand_CreateReg0(in_RDI,0xaa);
      break;
    case 0xae:
      MCOperand_CreateReg0(in_RDI,0xab);
      break;
    case 0xaf:
      MCOperand_CreateReg0(in_RDI,0xac);
      break;
    case 0xb0:
      MCOperand_CreateReg0(in_RDI,0xad);
      break;
    case 0xb1:
      MCOperand_CreateReg0(in_RDI,0xae);
      break;
    case 0xb2:
      MCOperand_CreateReg0(in_RDI,0xaf);
      break;
    case 0xb3:
      MCOperand_CreateReg0(in_RDI,0xb0);
      break;
    case 0xb4:
      MCOperand_CreateReg0(in_RDI,0xb1);
      break;
    case 0xb5:
      MCOperand_CreateReg0(in_RDI,0xb2);
      break;
    case 0xb6:
      MCOperand_CreateReg0(in_RDI,0xb3);
      break;
    case 0xb7:
      MCOperand_CreateReg0(in_RDI,0xb4);
      break;
    case 0xb8:
      MCOperand_CreateReg0(in_RDI,0xb5);
      break;
    case 0xb9:
      MCOperand_CreateReg0(in_RDI,0xb6);
      break;
    case 0xba:
      MCOperand_CreateReg0(in_RDI,0xb7);
      break;
    case 0xbb:
      MCOperand_CreateReg0(in_RDI,0xb8);
      break;
    case 0xbc:
      MCOperand_CreateReg0(in_RDI,0xb9);
      break;
    case 0xbd:
      MCOperand_CreateReg0(in_RDI,0xba);
      break;
    case 0xbe:
      MCOperand_CreateReg0(in_RDI,0xbb);
      break;
    case 0xbf:
      MCOperand_CreateReg0(in_RDI,0xbc);
      break;
    case 0xc0:
      MCOperand_CreateReg0(in_RDI,0xbd);
      break;
    case 0xc1:
      MCOperand_CreateReg0(in_RDI,0xbe);
      break;
    case 0xc2:
      MCOperand_CreateReg0(in_RDI,0xbf);
      break;
    case 0xc3:
      MCOperand_CreateReg0(in_RDI,0xc0);
      break;
    case 0xc4:
      MCOperand_CreateReg0(in_RDI,0xc1);
      break;
    case 0xc5:
      MCOperand_CreateReg0(in_RDI,0xc2);
      break;
    case 0xc6:
      MCOperand_CreateReg0(in_RDI,0xc3);
      break;
    case 199:
      MCOperand_CreateReg0(in_RDI,0xc4);
      break;
    case 200:
      MCOperand_CreateReg0(in_RDI,0xc5);
      break;
    case 0xc9:
      MCOperand_CreateReg0(in_RDI,0xc6);
      break;
    case 0xca:
      MCOperand_CreateReg0(in_RDI,199);
      break;
    case 0xcb:
      MCOperand_CreateReg0(in_RDI,200);
      break;
    case 0xcc:
      MCOperand_CreateReg0(in_RDI,0xc9);
      break;
    case 0xcd:
      MCOperand_CreateReg0(in_RDI,0xca);
      break;
    case 0xce:
      MCOperand_CreateReg0(in_RDI,0xcb);
      break;
    case 0xcf:
      MCOperand_CreateReg0(in_RDI,0xcc);
      break;
    case 0xd0:
      MCOperand_CreateReg0(in_RDI,0xcd);
      break;
    case 0xd1:
      MCOperand_CreateReg0(in_RDI,0xce);
      break;
    case 0xd2:
      MCOperand_CreateReg0(in_RDI,0xcf);
      break;
    case 0xd3:
      MCOperand_CreateReg0(in_RDI,0xd0);
      break;
    case 0xd4:
      MCOperand_CreateReg0(in_RDI,0xd1);
      break;
    case 0xd5:
      MCOperand_CreateReg0(in_RDI,0xd2);
      break;
    case 0xd6:
      MCOperand_CreateReg0(in_RDI,0xd3);
      break;
    case 0xd7:
      MCOperand_CreateReg0(in_RDI,0xd4);
      break;
    case 0xd8:
      MCOperand_CreateReg0(in_RDI,0xd5);
      break;
    case 0xd9:
      MCOperand_CreateReg0(in_RDI,0xd6);
      break;
    case 0xda:
      MCOperand_CreateReg0(in_RDI,0xd7);
      break;
    case 0xdb:
      MCOperand_CreateReg0(in_RDI,0xd8);
      break;
    case 0xdc:
      MCOperand_CreateReg0(in_RDI,0xd9);
      break;
    case 0xdd:
      MCOperand_CreateReg0(in_RDI,0x5a);
      break;
    case 0xde:
      MCOperand_CreateReg0(in_RDI,0x5b);
      break;
    case 0xdf:
      MCOperand_CreateReg0(in_RDI,0x5c);
      break;
    case 0xe0:
      MCOperand_CreateReg0(in_RDI,0x5d);
      break;
    case 0xe1:
      MCOperand_CreateReg0(in_RDI,0x5e);
      break;
    case 0xe2:
      MCOperand_CreateReg0(in_RDI,0x5f);
      break;
    case 0xe3:
      MCOperand_CreateReg0(in_RDI,0x60);
      break;
    case 0xe4:
      MCOperand_CreateReg0(in_RDI,0x61);
      break;
    case 0xe5:
      MCOperand_CreateReg0(in_RDI,0x1c);
      break;
    case 0xe6:
      MCOperand_CreateReg0(in_RDI,0xb);
      break;
    case 0xe7:
      MCOperand_CreateReg0(in_RDI,0x31);
      break;
    case 0xe8:
      MCOperand_CreateReg0(in_RDI,0x11);
      break;
    case 0xe9:
      MCOperand_CreateReg0(in_RDI,0x20);
      break;
    case 0xea:
      MCOperand_CreateReg0(in_RDI,0x21);
      break;
    case 0xeb:
      MCOperand_CreateReg0(in_RDI,0x42);
      break;
    case 0xec:
      MCOperand_CreateReg0(in_RDI,0x43);
      break;
    case 0xed:
      MCOperand_CreateReg0(in_RDI,0x44);
      break;
    case 0xee:
      MCOperand_CreateReg0(in_RDI,0x45);
      break;
    case 0xef:
      MCOperand_CreateReg0(in_RDI,0x46);
      break;
    case 0xf0:
      MCOperand_CreateReg0(in_RDI,0x47);
      break;
    case 0xf1:
      MCOperand_CreateReg0(in_RDI,0x48);
      break;
    case 0xf2:
      MCOperand_CreateReg0(in_RDI,0x49);
      break;
    case 0xf3:
      MCOperand_CreateReg0(in_RDI,0x4a);
      break;
    case 0xf4:
      MCOperand_CreateReg0(in_RDI,0x4b);
      break;
    case 0xf5:
      MCOperand_CreateReg0(in_RDI,0x4c);
      break;
    case 0xf6:
      MCOperand_CreateReg0(in_RDI,0x4d);
      break;
    case 0xf7:
      MCOperand_CreateReg0(in_RDI,0x4e);
      break;
    case 0xf8:
      MCOperand_CreateReg0(in_RDI,0x4f);
      break;
    case 0xf9:
      MCOperand_CreateReg0(in_RDI,0x50);
      break;
    case 0xfa:
      MCOperand_CreateReg0(in_RDI,0x51);
      break;
    case 0xfb:
      MCOperand_CreateReg0(in_RDI,0x32);
      break;
    case 0xfc:
      MCOperand_CreateReg0(in_RDI,0x33);
      break;
    case 0xfd:
      MCOperand_CreateReg0(in_RDI,0x34);
      break;
    case 0xfe:
      MCOperand_CreateReg0(in_RDI,0x35);
      break;
    case 0xff:
      MCOperand_CreateReg0(in_RDI,0x36);
      break;
    case 0x100:
      MCOperand_CreateReg0(in_RDI,0x37);
      break;
    case 0x101:
      MCOperand_CreateReg0(in_RDI,0x38);
      break;
    case 0x102:
      MCOperand_CreateReg0(in_RDI,0x39);
      break;
    case 0x103:
      MCOperand_CreateReg0(in_RDI,0x3a);
      break;
    case 0x104:
      MCOperand_CreateReg0(in_RDI,0x3b);
      break;
    case 0x105:
      MCOperand_CreateReg0(in_RDI,0x3c);
      break;
    case 0x106:
      MCOperand_CreateReg0(in_RDI,0x3d);
      break;
    case 0x107:
      MCOperand_CreateReg0(in_RDI,0x3e);
      break;
    case 0x108:
      MCOperand_CreateReg0(in_RDI,0x3f);
      break;
    case 0x109:
      MCOperand_CreateReg0(in_RDI,0x40);
      break;
    case 0x10a:
      MCOperand_CreateReg0(in_RDI,0x41);
      break;
    case 0x10b:
      MCOperand_CreateReg0(in_RDI,0x29);
      break;
    default:
      return true;
    }
    return false;
  }
  return true;
}

Assistant:

static bool translateRMRegister(MCInst *mcInst, InternalInstruction *insn)
{
	if (insn->eaBase == EA_BASE_sib || insn->eaBase == EA_BASE_sib64) {
		//debug("A R/M register operand may not have a SIB byte");
		return true;
	}

	switch (insn->eaBase) {
		case EA_BASE_NONE:
			//debug("EA_BASE_NONE for ModR/M base");
			return true;
#define ENTRY(x) case EA_BASE_##x:
			ALL_EA_BASES
#undef ENTRY
				//debug("A R/M register operand may not have a base; "
				//      "the operand must be a register.");
				return true;
#define ENTRY(x)                                                      \
		case EA_REG_##x:                                                    \
			MCOperand_CreateReg0(mcInst, X86_##x); break;
			ALL_REGS
#undef ENTRY
		default:
				//debug("Unexpected EA base register");
				return true;
	}

	return false;
}